

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void DC16NoLeft_SSE2(uint8_t *dst,uint8_t *top)

{
  int iVar1;
  longlong *in_RSI;
  uint8_t *in_RDI;
  int DC;
  __m128i top_row;
  longlong local_28;
  longlong lStack_20;
  uint8_t *local_10;
  
  local_28 = *in_RSI;
  lStack_20 = in_RSI[1];
  local_10 = in_RDI;
  iVar1 = VP8HorizontalAdd8b((__m128i *)&local_28);
  Put16_SSE2((uint8_t)(iVar1 + 8 >> 4),local_10);
  return;
}

Assistant:

static void DC16NoLeft_SSE2(uint8_t* dst) {  // DC with left samples unavailable
  const __m128i zero = _mm_setzero_si128();
  const __m128i top = _mm_loadu_si128((const __m128i*)(dst - BPS));
  const __m128i sad8x2 = _mm_sad_epu8(top, zero);
  // sum the two sads: sad8x2[0:1] + sad8x2[8:9]
  const __m128i sum = _mm_add_epi16(sad8x2, _mm_shuffle_epi32(sad8x2, 2));
  const int DC = _mm_cvtsi128_si32(sum) + 8;
  Put16_SSE2(DC >> 4, dst);
}